

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

bool __thiscall node::anon_unknown_2::NodeImpl::getNetworkActive(NodeImpl *this)

{
  CConnman *pCVar1;
  __atomic_base<bool> _Var2;
  long in_FS_OFFSET;
  
  pCVar1 = (this->m_context->connman)._M_t.
           super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
           super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
           super__Head_base<0UL,_CConnman_*,_false>._M_head_impl;
  if (pCVar1 == (CConnman *)0x0) {
    _Var2._M_i = false;
  }
  else {
    _Var2._M_i = (pCVar1->fNetworkActive)._M_base._M_i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (bool)(_Var2._M_i & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool getNetworkActive() override { return m_context->connman && m_context->connman->GetNetworkActive(); }